

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

int CP_sendToPeer(SstStream s,CP_PeerCohort Cohort,int Rank,CMFormat Format,void *Data)

{
  undefined8 *puVar1;
  int iVar2;
  CMConnection p_Var3;
  char *Format_00;
  ulong uVar4;
  SstStream p_Var5;
  code *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar1 = (undefined8 *)((long)Cohort + (long)Rank * 0x18);
  if (*(long *)((long)Cohort + (long)Rank * 0x18 + 0x10) == 0) {
    p_Var3 = Tunneling_get_conn(s->CPInfo->SharedCM->cm,(attr_list)*puVar1);
    puVar1[2] = p_Var3;
    if (p_Var3 == (CMConnection)0x0) {
      CP_error(s,"Connection failed in CP_sendToPeer! Contact list was:\n");
      Format_00 = (char *)attr_list_to_string(*puVar1);
      CP_error(s,Format_00);
      return 0;
    }
    if (s->Role == ReaderRole) {
      CP_verbose(s,TraceVerbose,"Registering reader close handler for peer %d CONNECTION %p\n",
                 (ulong)(uint)Rank,p_Var3);
      uVar7 = puVar1[2];
      pcVar6 = ReaderConnCloseHandler;
      p_Var5 = s;
    }
    else {
      uVar8 = 0;
      uVar4 = (ulong)(uint)s->ReaderCount;
      if (s->ReaderCount < 1) {
        uVar4 = uVar8;
      }
      do {
        uVar9 = uVar8;
        if (uVar4 == uVar9) goto LAB_006c2d23;
        uVar8 = uVar9 + 1;
      } while (s->Readers[uVar9]->Connections != (CP_PeerConnection *)Cohort);
      CP_verbose(s,TraceVerbose,"Registering writer close handler for peer %d, CONNECTION %p\n",
                 (ulong)(uint)Rank,p_Var3);
      uVar7 = puVar1[2];
      pcVar6 = WriterConnCloseHandler;
      p_Var5 = (SstStream)s->Readers[uVar9];
    }
    CMconn_register_close_handler(uVar7,pcVar6,p_Var5);
  }
LAB_006c2d23:
  iVar2 = CMwrite(puVar1[2],Format,Data);
  if (iVar2 != 1) {
    CP_verbose(s,CriticalVerbose,
               "Message failed to send to peer %d CONNECTION %p in CP_sendToPeer()\n",
               (ulong)(uint)Rank,puVar1[2]);
  }
  return (uint)(iVar2 == 1);
}

Assistant:

static int CP_sendToPeer(SstStream s, CP_PeerCohort Cohort, int Rank, CMFormat Format, void *Data)
{
    CP_PeerConnection *Peers = (CP_PeerConnection *)Cohort;
    if (Peers[Rank].CMconn == NULL)
    {
        Peers[Rank].CMconn = Tunneling_get_conn(s->CPInfo->SharedCM->cm, Peers[Rank].ContactList);
        if (!Peers[Rank].CMconn)
        {
            CP_error(s, "Connection failed in CP_sendToPeer! Contact list was:\n");
            CP_error(s, attr_list_to_string(Peers[Rank].ContactList));
            return 0;
        }
        if (s->Role == ReaderRole)
        {
            CP_verbose(s, TraceVerbose,
                       "Registering reader close handler for peer %d CONNECTION %p\n", Rank,
                       Peers[Rank].CMconn);
            CMconn_register_close_handler(Peers[Rank].CMconn, ReaderConnCloseHandler, (void *)s);
        }
        else
        {
            for (int i = 0; i < s->ReaderCount; i++)
            {
                if (Peers == s->Readers[i]->Connections)
                {
                    CP_verbose(s, TraceVerbose,
                               "Registering writer close handler for peer %d, "
                               "CONNECTION %p\n",
                               Rank, Peers[Rank].CMconn);
                    CMconn_register_close_handler(Peers[Rank].CMconn, WriterConnCloseHandler,
                                                  (void *)s->Readers[i]);
                    break;
                }
            }
        }
    }
    if (CMwrite(Peers[Rank].CMconn, Format, Data) != 1)
    {
        CP_verbose(s, CriticalVerbose,
                   "Message failed to send to peer %d CONNECTION %p in "
                   "CP_sendToPeer()\n",
                   Rank, Peers[Rank].CMconn);
        return 0;
    }
    return 1;
}